

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::GcCompactTransientWindowBuffers(ImGuiWindow *window)

{
  int *piVar1;
  uint *puVar2;
  ImGuiWindow **ppIVar3;
  int *piVar4;
  float *pfVar5;
  ImGuiGroupData *pIVar6;
  
  window->MemoryCompacted = true;
  puVar2 = (window->IDStack).Data;
  window->MemoryDrawListIdxCapacity = (window->DrawList->IdxBuffer).Capacity;
  window->MemoryDrawListVtxCapacity = (window->DrawList->VtxBuffer).Capacity;
  if (puVar2 != (uint *)0x0) {
    (window->IDStack).Size = 0;
    (window->IDStack).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + -1;
    }
    (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
    (window->IDStack).Data = (uint *)0x0;
  }
  ImDrawList::ClearFreeMemory(window->DrawList);
  ppIVar3 = (window->DC).ChildWindows.Data;
  if (ppIVar3 != (ImGuiWindow **)0x0) {
    (window->DC).ChildWindows.Size = 0;
    (window->DC).ChildWindows.Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + -1;
    }
    (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
    (window->DC).ChildWindows.Data = (ImGuiWindow **)0x0;
  }
  piVar4 = (window->DC).ItemFlagsStack.Data;
  if (piVar4 != (int *)0x0) {
    (window->DC).ItemFlagsStack.Size = 0;
    (window->DC).ItemFlagsStack.Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar4,GImAllocatorUserData);
    (window->DC).ItemFlagsStack.Data = (int *)0x0;
  }
  pfVar5 = (window->DC).ItemWidthStack.Data;
  if (pfVar5 != (float *)0x0) {
    (window->DC).ItemWidthStack.Size = 0;
    (window->DC).ItemWidthStack.Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + -1;
    }
    (*GImAllocatorFreeFunc)(pfVar5,GImAllocatorUserData);
    (window->DC).ItemWidthStack.Data = (float *)0x0;
  }
  pfVar5 = (window->DC).TextWrapPosStack.Data;
  if (pfVar5 != (float *)0x0) {
    (window->DC).TextWrapPosStack.Size = 0;
    (window->DC).TextWrapPosStack.Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + -1;
    }
    (*GImAllocatorFreeFunc)(pfVar5,GImAllocatorUserData);
    (window->DC).TextWrapPosStack.Data = (float *)0x0;
  }
  pIVar6 = (window->DC).GroupStack.Data;
  if (pIVar6 != (ImGuiGroupData *)0x0) {
    (window->DC).GroupStack.Size = 0;
    (window->DC).GroupStack.Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
    (window->DC).GroupStack.Data = (ImGuiGroupData *)0x0;
  }
  return;
}

Assistant:

void ImGui::GcCompactTransientWindowBuffers(ImGuiWindow* window)
{
    window->MemoryCompacted = true;
    window->MemoryDrawListIdxCapacity = window->DrawList->IdxBuffer.Capacity;
    window->MemoryDrawListVtxCapacity = window->DrawList->VtxBuffer.Capacity;
    window->IDStack.clear();
    window->DrawList->ClearFreeMemory();
    window->DC.ChildWindows.clear();
    window->DC.ItemFlagsStack.clear();
    window->DC.ItemWidthStack.clear();
    window->DC.TextWrapPosStack.clear();
    window->DC.GroupStack.clear();
}